

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  sqlite3_vtab_cursor *ppStmt;
  sqlite3_vtab *psVar1;
  u8 *puVar2;
  sqlite3_vtab *pStmt;
  int iVar3;
  RtreeNode *pRVar4;
  sqlite3_value *pFrom;
  long lVar5;
  i64 iValue;
  undefined4 in_register_00000014;
  sqlite3_vtab *psVar6;
  MemValue val;
  Mem *pMem;
  int rc;
  int local_44;
  sqlite3_context *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,i);
  if (*(char *)((long)&cur[1].pVtab + 1) == '\0') {
    if (*(int *)((long)&cur[4].pVtab + 4) == 0) {
      psVar6 = (sqlite3_vtab *)0x0;
    }
    else {
      psVar6 = cur[6].pVtab;
    }
  }
  else {
    psVar6 = (sqlite3_vtab *)(cur + 8);
  }
  psVar1 = cur->pVtab;
  local_44 = 0;
  local_40 = ctx;
  pRVar4 = rtreeNodeOfFirstSearchPoint((RtreeCursor *)cur,&local_44);
  if (local_44 != 0) {
    return local_44;
  }
  if (psVar6 == (sqlite3_vtab *)0x0) {
    return 0;
  }
  iVar3 = (int)local_38;
  if (iVar3 == 0) {
    val.i = readInt64(pRVar4->zData +
                      (ulong)(byte)psVar1[1].field_0xf *
                      (ulong)*(byte *)((long)&psVar6->zErrMsg + 2) + 4);
    pMem = local_40->pOut;
    if ((pMem->flags & 0x2400) == 0) {
      (pMem->u).i = (i64)val;
      goto LAB_001c9ae2;
    }
  }
  else {
    if ((int)(uint)(byte)psVar1[1].field_0xd < iVar3) {
      if (*(char *)((long)&cur[1].pVtab + 2) == '\0') {
        ppStmt = cur + 7;
        if (cur[7].pVtab == (sqlite3_vtab *)0x0) {
          iVar3 = sqlite3LockAndPrepare
                            ((sqlite3 *)psVar1[1].pModule,psVar1[3].zErrMsg,-1,0x80,(Vdbe *)0x0,
                             (sqlite3_stmt **)ppStmt,(char **)0x0);
          if (iVar3 != 0) {
            return iVar3;
          }
          local_44 = 0;
        }
        pStmt = ppStmt->pVtab;
        iValue = readInt64(pRVar4->zData +
                           (ulong)(byte)psVar1[1].field_0xf *
                           (ulong)*(byte *)((long)&psVar6->zErrMsg + 2) + 4);
        sqlite3_bind_int64((sqlite3_stmt *)pStmt,1,iValue);
        iVar3 = sqlite3_step((sqlite3_stmt *)ppStmt->pVtab);
        if (iVar3 != 100) {
          local_44 = iVar3;
          sqlite3_reset((sqlite3_stmt *)ppStmt->pVtab);
          if (iVar3 != 0x65) {
            return local_44;
          }
          return 0;
        }
        *(undefined1 *)((long)&cur[1].pVtab + 2) = 1;
        iVar3 = (int)local_38;
        local_44 = 100;
      }
      pFrom = sqlite3_column_value
                        ((sqlite3_stmt *)cur[7].pVtab,(iVar3 - (uint)(byte)psVar1[1].field_0xd) + 1)
      ;
      sqlite3VdbeMemCopy(local_40->pOut,pFrom);
      return 0;
    }
    puVar2 = pRVar4->zData;
    lVar5 = (long)(int)((uint)(byte)psVar1[1].field_0xf *
                        (uint)*(byte *)((long)&psVar6->zErrMsg + 2) + iVar3 * 4 + 8);
    val.i = (ulong)puVar2[lVar5 + 3] |
            (ulong)puVar2[lVar5 + 2] << 8 |
            (long)(int)((uint)puVar2[lVar5] << 0x18) | (ulong)puVar2[lVar5 + 1] << 0x10;
    if (psVar1[1].field_0xe == '\0') {
      sqlite3VdbeMemSetDouble(local_40->pOut,(double)(float)val.nZero);
      return 0;
    }
    pMem = local_40->pOut;
    if ((pMem->flags & 0x2400) == 0) {
      pMem->u = val;
LAB_001c9ae2:
      pMem->flags = 4;
      return 0;
    }
  }
  vdbeReleaseAndSetInt64(pMem,val.i);
  return 0;
}

Assistant:

static int rtreeColumn(sqlite3_vtab_cursor *cur, sqlite3_context *ctx, int i){
  Rtree *pRtree = (Rtree *)cur->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  RtreeCoord c;
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);

  if( rc ) return rc;
  if( p==0 ) return SQLITE_OK;
  if( i==0 ){
    sqlite3_result_int64(ctx, nodeGetRowid(pRtree, pNode, p->iCell));
  }else if( i<=pRtree->nDim2 ){
    nodeGetCoord(pRtree, pNode, p->iCell, i-1, &c);
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      sqlite3_result_double(ctx, c.f);
    }else
#endif
    {
      assert( pRtree->eCoordType==RTREE_COORD_INT32 );
      sqlite3_result_int(ctx, c.i);
    }
  }else{
    if( !pCsr->bAuxValid ){
      if( pCsr->pReadAux==0 ){
        rc = sqlite3_prepare_v3(pRtree->db, pRtree->zReadAuxSql, -1, 0,
                                &pCsr->pReadAux, 0);
        if( rc ) return rc;
      }
      sqlite3_bind_int64(pCsr->pReadAux, 1, 
          nodeGetRowid(pRtree, pNode, p->iCell));
      rc = sqlite3_step(pCsr->pReadAux);
      if( rc==SQLITE_ROW ){
        pCsr->bAuxValid = 1;
      }else{
        sqlite3_reset(pCsr->pReadAux);
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
        return rc;
      }
    }
    sqlite3_result_value(ctx,
         sqlite3_column_value(pCsr->pReadAux, i - pRtree->nDim2 + 1));
  }  
  return SQLITE_OK;
}